

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::IsValidObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  BOOLEAN BVar2;
  ushort uVar3;
  uint uVar4;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar4 = 0;
  if (objectAddress < pcVar1 + 0x8000 && pcVar1 <= objectAddress) {
    uVar3 = GetAddressIndex(this,objectAddress);
    if (uVar3 != 0xffff) {
      uVar3 = GetAddressBitIndex(objectAddress);
      BVar2 = BVStatic<2048UL>::Test(&this->debugFreeBits,(uint)uVar3);
      uVar4 = (uint)(BVar2 == '\0');
    }
  }
  return uVar4;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsValidObject(void* objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }
#if DBG
    return !this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
#else
    return true;
#endif
}